

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMULibCal.cpp
# Opt level: O0

void processEllipsoid(void)

{
  __pid_t _Var1;
  uint local_10;
  __pid_t local_c;
  int status;
  pid_t pid;
  
  printf("\n\nProcessing ellipsoid fit data...\n");
  local_c = fork();
  if (local_c != 0) {
    if (local_c < 0) {
      printf("\nFailed to start ellipsoid fitting code.\n");
    }
    else {
      _Var1 = waitpid(local_c,(int *)&local_10,0);
      if (_Var1 == local_c) {
        if (local_10 == 0) {
          printf("\nEllipsoid fit completed - saving data to file.");
          RTIMUMagCal::magCalSaveCorr((char *)magCal);
        }
        else {
          printf("\nEllipsoid fit returned %d - aborting.\n",(ulong)local_10);
        }
      }
      else {
        printf("\n\nEllipsoid fit failed, %d\n",(ulong)local_10);
      }
    }
    return;
  }
  chdir("../RTEllipsoidFit/");
  execl("/bin/sh","/bin/sh","-c","octave RTEllipsoidFit.m",0);
  printf("here");
  _exit(1);
}

Assistant:

void processEllipsoid()
{
    pid_t pid;
    int status;

    printf("\n\nProcessing ellipsoid fit data...\n");

    pid = fork();
    if (pid == 0) {
        //  child process
        chdir(ELLIPSOID_FIT_DIR);
        execl("/bin/sh", "/bin/sh", "-c", RTIMUCALDEFS_OCTAVE_COMMAND, NULL);
        printf("here");
        _exit(EXIT_FAILURE);
    } else if (pid < 0) {
        printf("\nFailed to start ellipsoid fitting code.\n");
        return;
    } else {
        //  parent process - wait for child
        if (waitpid(pid, &status, 0) != pid) {
            printf("\n\nEllipsoid fit failed, %d\n", status);
        } else {
            if (status == 0) {
                printf("\nEllipsoid fit completed - saving data to file.");
                magCal->magCalSaveCorr(ELLIPSOID_FIT_DIR);
            } else {
                printf("\nEllipsoid fit returned %d - aborting.\n", status);
            }
        }
    }
}